

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O3

xmlAutomataPtr xmlNewAutomata(void)

{
  int iVar1;
  xmlRegParserCtxtPtr ctxt;
  xmlRegStatePtr state;
  
  ctxt = (xmlRegParserCtxtPtr)(*xmlMalloc)(0x78);
  if (ctxt != (xmlRegParserCtxtPtr)0x0) {
    ctxt->counters = (xmlRegCounter *)0x0;
    ctxt->determinist = 0;
    ctxt->negs = 0;
    ctxt->states = (xmlRegStatePtr *)0x0;
    ctxt->maxCounters = 0;
    ctxt->nbCounters = 0;
    ctxt->atoms = (xmlRegAtomPtr *)0x0;
    ctxt->maxStates = 0;
    ctxt->nbStates = 0;
    ctxt->atom = (xmlRegAtomPtr)0x0;
    ctxt->maxAtoms = 0;
    ctxt->nbAtoms = 0;
    ctxt->end = (xmlRegStatePtr)0x0;
    ctxt->state = (xmlRegStatePtr)0x0;
    ctxt->error = 0;
    ctxt->neg = 0;
    ctxt->start = (xmlRegStatePtr)0x0;
    ctxt->string = (xmlChar *)0x0;
    ctxt->cur = (xmlChar *)0x0;
    ctxt->flags = 0;
    ctxt->depth = 0;
    ctxt->determinist = -1;
    state = (xmlRegStatePtr)(*xmlMalloc)(0x38);
    if (state == (xmlRegStatePtr)0x0) {
      xmlRegexpErrMemory(ctxt,"allocating state");
      ctxt->state = (xmlRegStatePtr)0x0;
      ctxt->start = (xmlRegStatePtr)0x0;
    }
    else {
      state->maxTransTo = 0;
      state->nbTransTo = 0;
      state->transTo = (int *)0x0;
      *(undefined8 *)&state->nbTrans = 0;
      state->trans = (xmlRegTrans *)0x0;
      state->markd = XML_REGEXP_MARK_NORMAL;
      state->reached = XML_REGEXP_MARK_NORMAL;
      state->no = 0;
      state->maxTrans = 0;
      state->mark = XML_REGEXP_MARK_NORMAL;
      ctxt->state = state;
      ctxt->start = state;
      state->type = XML_REGEXP_START_STATE;
      iVar1 = xmlRegStatePush(ctxt,state);
      if (-1 < iVar1) {
        ctxt->flags = 0;
        return ctxt;
      }
      xmlRegFreeState(ctxt->start);
    }
    xmlRegFreeParserCtxt(ctxt);
  }
  return (xmlAutomataPtr)0x0;
}

Assistant:

xmlAutomataPtr
xmlNewAutomata(void) {
    xmlAutomataPtr ctxt;

    ctxt = xmlRegNewParserCtxt(NULL);
    if (ctxt == NULL)
	return(NULL);

    /* initialize the parser */
    ctxt->end = NULL;
    ctxt->start = ctxt->state = xmlRegNewState(ctxt);
    if (ctxt->start == NULL) {
	xmlFreeAutomata(ctxt);
	return(NULL);
    }
    ctxt->start->type = XML_REGEXP_START_STATE;
    if (xmlRegStatePush(ctxt, ctxt->start) < 0) {
        xmlRegFreeState(ctxt->start);
	xmlFreeAutomata(ctxt);
	return(NULL);
    }
    ctxt->flags = 0;

    return(ctxt);
}